

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall
ON_NurbsSurface::Split
          (ON_NurbsSurface *this,int dir,double c,ON_Surface **west_or_south_side,
          ON_Surface **east_or_north_side)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  ON_NurbsSurface *this_00;
  ON_NurbsCurve *pOVar5;
  ulong uVar6;
  _func_int **pp_Var7;
  int iVar8;
  ON_NurbsSurface *local_120;
  ON_Curve *right_side;
  ON_Curve *left_side;
  ON_NurbsCurve crv;
  ON_NurbsCurve right_crv;
  ON_NurbsCurve left_crv;
  
  if (1 < (uint)dir) {
    return false;
  }
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
  bVar3 = ON_Interval::Includes((ON_Interval *)&crv,c,true);
  if (!bVar3) {
    return false;
  }
  if ((ON_Object *)*west_or_south_side == (ON_Object *)0x0) {
    this_00 = (ON_NurbsSurface *)0x0;
  }
  else {
    this_00 = Cast((ON_Object *)*west_or_south_side);
    if (this_00 == (ON_NurbsSurface *)0x0) {
      return false;
    }
    ON_Surface::DestroySurfaceTree(&this_00->super_ON_Surface);
  }
  if ((ON_Object *)*east_or_north_side == (ON_Object *)0x0) {
    local_120 = (ON_NurbsSurface *)0x0;
  }
  else {
    local_120 = Cast((ON_Object *)*east_or_north_side);
    if (local_120 == (ON_NurbsSurface *)0x0) {
      return false;
    }
    ON_Surface::DestroySurfaceTree(&local_120->super_ON_Surface);
  }
  ON_NurbsCurve::ON_NurbsCurve(&crv);
  ON_NurbsCurve::ON_NurbsCurve(&left_crv);
  ON_NurbsCurve::ON_NurbsCurve(&right_crv);
  pOVar5 = ToCurve(this,dir,&crv);
  if ((pOVar5 != (ON_NurbsCurve *)0x0) &&
     (right_side = &right_crv.super_ON_Curve, left_side = &left_crv.super_ON_Curve,
     bVar3 = ON_NurbsCurve::Split(&crv,c,&left_side,&right_side), bVar3)) {
    if (this_00 == (ON_NurbsSurface *)0x0) {
      this_00 = (ON_NurbsSurface *)operator_new(0x58);
      ON_NurbsSurface(this_00);
    }
    if (this_00 != this) {
      iVar4 = this->m_is_rat;
      this_00->m_dim = this->m_dim;
      this_00->m_is_rat = iVar4;
      iVar8 = 1 - dir;
      uVar6 = (ulong)(uint)(iVar8 * 4);
      *(undefined4 *)((long)this_00->m_order + uVar6) = *(undefined4 *)((long)this->m_order + uVar6)
      ;
      *(undefined4 *)((long)this_00->m_cv_count + uVar6) =
           *(undefined4 *)((long)this->m_cv_count + uVar6);
      iVar4 = KnotCount(this,iVar8);
      ReserveKnotCapacity(this_00,iVar8,iVar4);
      pvVar1 = *(void **)((long)this_00->m_knot + (ulong)(uint)(iVar8 * 8));
      pvVar2 = *(void **)((long)this->m_knot + (ulong)(uint)(iVar8 * 8));
      iVar4 = KnotCount(this,iVar8);
      memcpy(pvVar1,pvVar2,(long)iVar4 << 3);
    }
    bVar3 = FromCurve(&left_crv,this_00,dir);
    if (bVar3) {
      if (local_120 == (ON_NurbsSurface *)0x0) {
        local_120 = (ON_NurbsSurface *)operator_new(0x58);
        ON_NurbsSurface(local_120);
      }
      if (local_120 != this) {
        iVar4 = this->m_is_rat;
        local_120->m_dim = this->m_dim;
        local_120->m_is_rat = iVar4;
        iVar8 = 1 - dir;
        uVar6 = (ulong)(uint)(iVar8 * 4);
        *(undefined4 *)((long)local_120->m_order + uVar6) =
             *(undefined4 *)((long)this->m_order + uVar6);
        *(undefined4 *)((long)local_120->m_cv_count + uVar6) =
             *(undefined4 *)((long)this->m_cv_count + uVar6);
        iVar4 = KnotCount(this,iVar8);
        ReserveKnotCapacity(local_120,iVar8,iVar4);
        pvVar1 = *(void **)((long)local_120->m_knot + (ulong)(uint)(iVar8 * 8));
        pvVar2 = *(void **)((long)this->m_knot + (ulong)(uint)(iVar8 * 8));
        iVar4 = KnotCount(this,iVar8);
        memcpy(pvVar1,pvVar2,(long)iVar4 << 3);
      }
      bVar3 = FromCurve(&right_crv,local_120,dir);
      if (bVar3) {
        if ((ON_NurbsSurface *)*west_or_south_side == (ON_NurbsSurface *)0x0) {
          *west_or_south_side = &this_00->super_ON_Surface;
        }
        bVar3 = true;
        if (*east_or_north_side == (ON_Surface *)0x0) {
          *east_or_north_side = &local_120->super_ON_Surface;
        }
        goto LAB_0055679b;
      }
      if (this_00 == (ON_NurbsSurface *)*west_or_south_side || this_00 == this) {
        Destroy(this_00);
      }
      else {
        (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_00)
        ;
      }
      if ((local_120 != this) && (local_120 != (ON_NurbsSurface *)*east_or_north_side)) {
        pp_Var7 = (local_120->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
        this_00 = local_120;
        goto LAB_00556789;
      }
    }
    else {
      local_120 = this_00;
      if ((this_00 != this) && (this_00 != (ON_NurbsSurface *)*west_or_south_side)) {
        pp_Var7 = (this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
LAB_00556789:
        (*pp_Var7[4])(this_00);
        goto LAB_00556799;
      }
    }
    Destroy(local_120);
  }
LAB_00556799:
  bVar3 = false;
LAB_0055679b:
  ON_NurbsCurve::~ON_NurbsCurve(&right_crv);
  ON_NurbsCurve::~ON_NurbsCurve(&left_crv);
  ON_NurbsCurve::~ON_NurbsCurve(&crv);
  return bVar3;
}

Assistant:

bool ON_NurbsSurface::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  if ( dir < 0 || dir > 1 )
    return false;
  if ( !Domain(dir).Includes( c, true ) )
    return false;
  ON_NurbsSurface* left_srf = 0;
  ON_NurbsSurface* right_srf = 0;

  if ( west_or_south_side )
  {
    left_srf = ON_NurbsSurface::Cast( west_or_south_side );
    if ( !left_srf )
      return false;
    left_srf->DestroySurfaceTree();
  }

  if ( east_or_north_side )
  {
    right_srf = ON_NurbsSurface::Cast( east_or_north_side );
    if ( !right_srf )
      return false;
    right_srf->DestroySurfaceTree();
  }

  ON_NurbsCurve crv, left_crv, right_crv;
  if ( !ToCurve( *this, dir, &crv ) )
    return false;
  ON_Curve *left_side, *right_side;
  left_side = &left_crv;
  right_side = &right_crv;
  if ( !crv.Split( c, left_side, right_side ) )
    return false;
  
  if ( !left_srf )
    left_srf = new ON_NurbsSurface();

  if ( left_srf != this )
  {
    left_srf->m_dim = m_dim;
    left_srf->m_is_rat = m_is_rat;
    left_srf->m_order[1-dir] = m_order[1-dir];
    left_srf->m_cv_count[1-dir] = m_cv_count[1-dir];
    left_srf->ReserveKnotCapacity(1-dir,KnotCount(1-dir));
    memcpy( left_srf->m_knot[1-dir], m_knot[1-dir], KnotCount(1-dir)*sizeof(m_knot[1-dir][0] ) );
  }

  if ( !FromCurve( left_crv, *left_srf, dir ) )
  {
    if ( left_srf != this && left_srf !=  west_or_south_side )
      delete left_srf;
    else
      left_srf->Destroy();

    return false;
  }

  if ( !right_srf )
    right_srf = new ON_NurbsSurface();

  if ( right_srf != this )
  {
    right_srf->m_dim = m_dim;
    right_srf->m_is_rat = m_is_rat;
    right_srf->m_order[1-dir] = m_order[1-dir];
    right_srf->m_cv_count[1-dir] = m_cv_count[1-dir];
    right_srf->ReserveKnotCapacity(1-dir,KnotCount(1-dir));
    memcpy( right_srf->m_knot[1-dir], m_knot[1-dir], KnotCount(1-dir)*sizeof(m_knot[1-dir][0] ) );
  }

  if ( !FromCurve( right_crv, *right_srf, dir ) )
  {
    if ( left_srf != this && left_srf !=  west_or_south_side )
      delete left_srf;
    else
      left_srf->Destroy();

    if ( right_srf != this && right_srf !=  east_or_north_side )
      delete right_srf;
    else
      right_srf->Destroy();

    return false;
  }

  if ( !west_or_south_side)
    west_or_south_side = left_srf;

  if ( !east_or_north_side)
    east_or_north_side = right_srf;

  return true;  
}